

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorclock.h
# Opt level: O3

VC_ID __thiscall
VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::get_id_by_tid
          (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this,
          TID tid)

{
  VC_ID VVar1;
  iterator iVar2;
  TID local_c;
  
  local_c = tid;
  iVar2 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          ::find<unsigned_int>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      *)this,&local_c,
                     SUB168(ZEXT416(tid) * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(ZEXT416(tid) * ZEXT816(0xde5fb9d2630458e9),0));
  if (iVar2.ctrl_ ==
      (this->vc).
      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      .
      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      .ctrl_ + (this->vc).
               super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               .capacity_) {
    VVar1 = 0;
  }
  else {
    VVar1 = *(VC_ID *)((long)iVar2.field_1.slot_ + 8);
  }
  return VVar1;
}

Assistant:

VC_ID get_id_by_tid(TID tid) const {
    auto it = vc.find(tid);
    if (it != vc.end()) {
      return it->second;
    } else {
      return 0;
    }
  }